

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  size_type *psVar6;
  size_t __n;
  int iVar7;
  string *psVar8;
  string source_file_path;
  string output_file_path;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> lines;
  parse_context ctx;
  ifstream ifs;
  ofstream ofs;
  bool local_578;
  bool local_570;
  char *local_568;
  long local_560;
  char local_558;
  undefined7 uStack_557;
  char *local_548;
  long local_540;
  char local_538;
  undefined7 uStack_537;
  string local_528;
  string local_508;
  string local_4e8;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> local_4c8;
  undefined1 local_4b0 [16];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  bool local_480;
  bool local_47f;
  _Alloc_hider local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  size_t local_458;
  undefined1 uStack_450;
  undefined7 uStack_44f;
  undefined1 uStack_448;
  undefined8 uStack_447;
  long *local_438 [2];
  long local_428 [2];
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_568 = &local_558;
  local_560 = 0;
  local_558 = '\0';
  local_548 = &local_538;
  local_540 = 0;
  local_570 = false;
  local_538 = '\0';
  local_578 = true;
  bVar2 = 1 < argc;
  if (1 < argc) {
    local_578 = true;
    iVar7 = 1;
    local_570 = false;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_438,argv[iVar7],(allocator<char> *)&local_230);
      iVar3 = std::__cxx11::string::compare((char *)local_438);
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      if (iVar3 == 0) {
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (local_540 != 0)) {
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4e8,"No output file given, or given twice","");
          usage(&local_4e8);
          iVar7 = 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001060c3;
        }
        pcVar1 = argv[iVar7];
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)0x0,(ulong)pcVar1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_438,argv[iVar7],(allocator<char> *)&local_230);
        iVar3 = std::__cxx11::string::compare((char *)local_438);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        if (iVar3 == 0) {
          local_570 = true;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,argv[iVar7],(allocator<char> *)&local_230);
          iVar3 = std::__cxx11::string::compare((char *)local_438);
          if (local_438[0] != local_428) {
            operator_delete(local_438[0],local_428[0] + 1);
          }
          if (iVar3 == 0) {
            local_578 = false;
          }
          else {
            if (local_560 != 0) {
              local_438[0] = local_428;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_438,"Extra argument: ","");
              plVar5 = (long *)std::__cxx11::string::append((char *)local_438);
              psVar6 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar6) {
                local_528.field_2._M_allocated_capacity = *psVar6;
                local_528.field_2._8_8_ = plVar5[3];
                local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
              }
              else {
                local_528.field_2._M_allocated_capacity = *psVar6;
                local_528._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_528._M_string_length = plVar5[1];
              *plVar5 = (long)psVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              usage(&local_528);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p != &local_528.field_2) {
                operator_delete(local_528._M_dataplus._M_p,
                                local_528.field_2._M_allocated_capacity + 1);
              }
              if (local_438[0] != local_428) {
                operator_delete(local_438[0],local_428[0] + 1);
              }
              iVar7 = 1;
              goto LAB_001060c3;
            }
            pcVar1 = argv[iVar7];
            strlen(pcVar1);
            std::__cxx11::string::_M_replace((ulong)&local_568,0,(char *)0x0,(ulong)pcVar1);
          }
        }
      }
      iVar7 = iVar7 + 1;
      bVar2 = iVar7 < argc;
    } while (iVar7 < argc);
  }
  iVar7 = 0;
LAB_001060c3:
  if (bVar2) goto LAB_00106464;
  if (local_560 == 0) {
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"No input file given","");
    usage(&local_508);
    iVar7 = 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00106464;
  }
  std::ifstream::ifstream((istream *)local_438,(string *)&local_568,_S_in);
  if ((abStack_418[local_438[0][-3]] & 5) == 0) {
    std::ofstream::ofstream(&local_230);
    if (local_540 == 0) {
      psVar8 = (string *)&std::cout;
LAB_0010633f:
      local_4b0._0_8_ = (istream *)local_438;
      local_4b0._8_8_ = psVar8;
      local_4a0._M_p = (pointer)&local_490;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a0,local_568,local_568 + local_560);
      local_47f = local_578;
      local_480 = local_570;
      local_470 = 0;
      local_468._M_local_buf[0] = '\0';
      local_458 = 0;
      uStack_450 = 0;
      uStack_44f = 0;
      uStack_448 = 0;
      uStack_447 = 0;
      local_478._M_p = (pointer)&local_468;
      kiste::parse(&local_4c8,(parse_context *)local_4b0);
      kiste::write((int)local_4b0,&local_4c8,__n);
      std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::~vector(&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_p != &local_468) {
        operator_delete(local_478._M_p,
                        CONCAT71(local_468._M_allocated_capacity._1_7_,local_468._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != &local_490) {
        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
      }
    }
    else {
      psVar8 = (string *)&local_230;
      std::ofstream::open(psVar8,(_Ios_Openmode)&local_548);
      if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) goto LAB_0010633f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not open output file ",0x1b);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_548,local_540);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      iVar7 = 1;
      std::ostream::flush();
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Could not open ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_568,local_560);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    iVar7 = 1;
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_438);
LAB_00106464:
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
  }
  return iVar7;
}

Assistant:

auto main(int argc, char** argv) -> int
{
  auto source_file_path = std::string{};
  auto output_file_path = std::string{};
  auto report_exceptions = false;
  auto line_directives = true;

  for (int i = 1; i < argc; ++i)
  {
    if (std::string{argv[i]} == "--output")
    {
      if (i + 1 < argc and output_file_path.empty())
      {
        output_file_path = argv[i + 1];
        ++i;
      }
      else
      {
        return usage("No output file given, or given twice");
      }
    }
    else if (std::string{argv[i]} == "--report-exceptions")
    {
      report_exceptions = true;
    }
    else if (std::string{argv[i]} == "--no-line-directives")
    {
      line_directives = false;
    }
    else if (source_file_path.empty())
    {
      source_file_path = argv[i];
    }
    else
    {
      return usage(std::string{"Extra argument: "} + argv[i]);
    }
  }

  if (source_file_path.empty())
    return usage("No input file given");

  std::ifstream ifs{source_file_path};
  if (not ifs)
  {
    std::cerr << "Could not open " << source_file_path << std::endl;
    return 1;
  }

  std::ostream* os = &std::cout;
  std::ofstream ofs;
  if (not output_file_path.empty())
  {
    ofs.open(output_file_path, std::ios::out);
    if (not ofs)
    {
      std::cerr << "Could not open output file " << output_file_path << std::endl;
      return 1;
    }

    os = &ofs;
  }

  auto ctx = kiste::parse_context{ifs, *os, source_file_path, report_exceptions, line_directives};

  try
  {
    const auto lines = kiste::parse(ctx);
    kiste::write(ctx, lines);
  }
  catch (const kiste::parse_error& e)
  {
    std::cerr << "Parse error in file: " << ctx._filename << std::endl;
    std::cerr << "Line number: " << ctx._line_no << std::endl;
    std::cerr << "Message: " << e.what() << std::endl;
    std::cerr << "Line: " << ctx._line << std::endl;
    return 1;
  }
}